

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ConsumerIPCService::ChangeTraceConfig
          (ConsumerIPCService *this,ChangeTraceConfigRequest *req,
          DeferredChangeTraceConfigResponse *resp)

{
  pointer pCVar1;
  TraceConfig *pTVar2;
  AsyncResult<perfetto::protos::gen::ChangeTraceConfigResponse> local_38;
  RemoteConsumer *local_28;
  RemoteConsumer *remote_consumer;
  DeferredChangeTraceConfigResponse *resp_local;
  ChangeTraceConfigRequest *req_local;
  ConsumerIPCService *this_local;
  
  remote_consumer = (RemoteConsumer *)resp;
  resp_local = (DeferredChangeTraceConfigResponse *)req;
  req_local = (ChangeTraceConfigRequest *)this;
  local_28 = GetConsumerForCurrentRequest(this);
  pCVar1 = std::
           unique_ptr<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
           ::operator->(&local_28->service_endpoint);
  pTVar2 = protos::gen::ChangeTraceConfigRequest::trace_config
                     ((ChangeTraceConfigRequest *)resp_local);
  (*pCVar1->_vptr_ConsumerEndpoint[3])(pCVar1,pTVar2);
  ipc::AsyncResult<perfetto::protos::gen::ChangeTraceConfigResponse>::Create();
  ipc::Deferred<perfetto::protos::gen::ChangeTraceConfigResponse>::Resolve(resp,&local_38);
  ipc::AsyncResult<perfetto::protos::gen::ChangeTraceConfigResponse>::~AsyncResult(&local_38);
  return;
}

Assistant:

void ConsumerIPCService::ChangeTraceConfig(
    const protos::gen::ChangeTraceConfigRequest& req,
    DeferredChangeTraceConfigResponse resp) {
  RemoteConsumer* remote_consumer = GetConsumerForCurrentRequest();
  remote_consumer->service_endpoint->ChangeTraceConfig(req.trace_config());
  resp.Resolve(
      ipc::AsyncResult<protos::gen::ChangeTraceConfigResponse>::Create());
}